

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O2

void Diligent::HashCombine<unsigned_int,float,float,float,float,float,float>
               (size_t *Seed,uint *FirstArg,float *RestArgs,float *RestArgs_1,float *RestArgs_2,
               float *RestArgs_3,float *RestArgs_4,float *RestArgs_5)

{
  HashCombine<unsigned_int>(Seed,FirstArg);
  HashCombine<float,float,float,float,float,float>
            (Seed,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void HashCombine(std::size_t& Seed, const FirstArgType& FirstArg, const RestArgsType&... RestArgs) noexcept
{
    HashCombine(Seed, FirstArg);
    HashCombine(Seed, RestArgs...); // recursive call using pack expansion syntax
}